

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O2

string * __thiscall
spoa::Graph::GenerateConsensus_abi_cxx11_
          (string *__return_storage_ptr__,Graph *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *summary,bool verbose)

{
  uint uVar1;
  pointer puVar2;
  pointer ppNVar3;
  pointer ppNVar4;
  uint32_t uVar5;
  Node *this_00;
  invalid_argument *this_01;
  uint *puVar6;
  ulong uVar7;
  bool bVar8;
  Node **it;
  pointer ppNVar9;
  ulong uVar10;
  long lVar11;
  uint label;
  ulong unaff_R13;
  ulong uVar12;
  pointer ppNVar13;
  vector<unsigned_int,_std::allocator<unsigned_int>_> node_id_to_column;
  
  if (summary == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_01,"[spoa::Graph::GenerateConsensus] error: invalid ptr to summary");
    __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  GenerateConsensus_abi_cxx11_(__return_storage_ptr__,this);
  puVar2 = (summary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((summary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (summary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  if (!verbose) {
    ppNVar3 = (this->consensus_).
              super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppNVar9 = (this->consensus_).
                   super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppNVar9 != ppNVar3;
        ppNVar9 = ppNVar9 + 1) {
      node_id_to_column.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<int>
                (summary,(int *)&node_id_to_column);
      uVar5 = Node::Coverage(*ppNVar9);
      puVar2 = (summary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish + -1;
      *puVar2 = *puVar2 + uVar5;
      ppNVar4 = ((*ppNVar9)->aligned_nodes).
                super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppNVar13 = ((*ppNVar9)->aligned_nodes).
                      super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                      _M_impl.super__Vector_impl_data._M_start; ppNVar13 != ppNVar4;
          ppNVar13 = ppNVar13 + 1) {
        uVar5 = Node::Coverage(*ppNVar13);
        puVar2 = (summary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish + -1;
        *puVar2 = *puVar2 + uVar5;
      }
    }
    return __return_storage_ptr__;
  }
  node_id_to_column.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (summary,((long)(this->consensus_).
                            super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->consensus_).
                            super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) *
                     (ulong)(this->num_codes_ + 1),(value_type_conflict1 *)&node_id_to_column);
  label = 0;
  InitializeMultipleSequenceAlignment(&node_id_to_column,this,(uint32_t *)0x0);
LAB_001085a8:
  ppNVar9 = (this->sequences_).
            super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->sequences_).
                    super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)ppNVar9 >> 3) <= (ulong)label)
  {
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&node_id_to_column.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    return __return_storage_ptr__;
  }
  this_00 = ppNVar9[label];
  lVar11 = CONCAT44(node_id_to_column.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start._4_4_,
                    node_id_to_column.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start._0_4_);
  uVar10 = 0;
  bVar8 = false;
  puVar6 = (uint *)(lVar11 + (ulong)this_00->id * 4);
  do {
    ppNVar9 = (this->consensus_).
              super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar7 = (long)(this->consensus_).
                  super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)ppNVar9 >> 3;
    for (; uVar10 < uVar7; uVar10 = (ulong)((uint)uVar10 + 1)) {
      uVar1 = *(uint *)(lVar11 + (ulong)ppNVar9[uVar10]->id * 4);
      if (*puVar6 <= uVar1) {
        if (uVar1 == *puVar6) {
          if (bVar8) {
            for (uVar12 = (ulong)((int)unaff_R13 + 1); (uint)uVar12 < (uint)uVar10;
                uVar12 = uVar12 + 1) {
              puVar2 = (summary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start + this->num_codes_ * uVar7 + uVar12;
              *puVar2 = *puVar2 + 1;
            }
          }
          bVar8 = true;
          puVar2 = (summary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start + this_00->code * uVar7 + uVar10;
          *puVar2 = *puVar2 + 1;
          unaff_R13 = uVar10;
        }
        break;
      }
    }
    if ((uVar7 == uVar10) || (this_00 = Node::Successor(this_00,label), this_00 == (Node *)0x0))
    break;
    lVar11 = CONCAT44(node_id_to_column.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start._4_4_,
                      node_id_to_column.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start._0_4_);
    puVar6 = (uint *)(lVar11 + (ulong)this_00->id * 4);
  } while( true );
  label = label + 1;
  goto LAB_001085a8;
}

Assistant:

std::string Graph::GenerateConsensus(
    std::vector<std::uint32_t>* summary,
    bool verbose) {
  if (!summary) {
    throw std::invalid_argument(
        "[spoa::Graph::GenerateConsensus] error: invalid ptr to summary");
  }

  auto dst = GenerateConsensus();

  summary->clear();
  if (!verbose) {
    for (const auto& it : consensus_) {
      summary->emplace_back(0);
      summary->back() += it->Coverage();
      for (const auto& jt : it->aligned_nodes) {
        summary->back() += jt->Coverage();
      }
    }
  } else {
    summary->resize((num_codes_ + 1) * consensus_.size(), 0);
    auto node_id_to_column = InitializeMultipleSequenceAlignment();

    for (std::uint32_t i = 0; i < sequences_.size(); ++i) {
      Node* it = sequences_[i];
      std::uint32_t c = 0, p, column = node_id_to_column[it->id];
      bool is_gap = false;
      while (true) {
        for (; c < consensus_.size(); ++c) {
          if (node_id_to_column[consensus_[c]->id] < column) {
            continue;
          } else {
            if (node_id_to_column[consensus_[c]->id] == column) {
              if (is_gap) {
                for (std::uint32_t j = p + 1; j < c; ++j) {
                  ++(*summary)[num_codes_ * consensus_.size() + j];
                }
              }
              is_gap = true;
              p = c;
              ++(*summary)[it->code * consensus_.size() + c];
            }
            break;
          }
        }
        if (c == consensus_.size() || !(it = it->Successor(i))) {
          break;
        }
        column = node_id_to_column[it->id];
      }
    }
  }

  return dst;
}